

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkers.cpp
# Opt level: O2

void snap_to_black_proc(Am_Object *inter,Am_Object *ref_obj,int x,int y,int *out_x,int *out_y)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Am_Value *pAVar8;
  uint uVar9;
  uint uVar10;
  Am_Object piece;
  Am_Object local_60;
  Am_Object piece_state;
  int y_local;
  int x_local;
  Am_Object board;
  Am_Object window;
  
  y_local = y;
  x_local = x;
  Am_Object::Get_Owner(&piece,(Am_Slot_Flags)inter);
  window.data = (Am_Object_Data *)0x0;
  pAVar8 = (Am_Value *)Am_Object::Get((ushort)&piece,0x68);
  Am_Object::operator=(&window,pAVar8);
  Am_Object::Get_Object((ushort)&board,(ulong)&window);
  Am_Object::Set((ushort)&piece,SUB21(MOVED,0),0);
  Am_Object::Set((ushort)&piece,SUB21(JUMPED,0),0);
  *out_x = x_local;
  *out_y = y_local;
  Am_Translate_Coordinates(ref_obj,x_local,y_local,&board,&x_local,&y_local);
  if (399 < (uint)y_local || 399 < (uint)x_local) goto LAB_00104362;
  uVar1 = (y_local + 0x19U & 0xffff) / 0x32;
  uVar2 = (x_local + 0x19U & 0xffff) / 0x32;
  if ((((uVar1 ^ uVar2) & 1) == 0) ||
     (Board[(x_local + 0x19U & 0xffff) / 100 + uVar1 * 4].piece != 0)) goto LAB_00104362;
  pAVar8 = (Am_Value *)Am_Object::Get((ushort)&piece,(ulong)BLACK_PLAYER);
  bVar4 = Am_Value::operator_cast_to_bool(pAVar8);
  pAVar8 = (Am_Value *)Am_Object::Get((ushort)&piece,0x85);
  Am_Value::operator_cast_to_int(pAVar8);
  piece_state.data = (Am_Object_Data *)0x0;
  if (bVar4) {
    Am_Object::Get_Object((ushort)&local_60,0x10c320);
    Am_Object::operator=(&piece_state,&local_60);
  }
  else {
    Am_Object::Get_Object((ushort)&local_60,0x10c318);
    Am_Object::operator=(&piece_state,&local_60);
  }
  Am_Object::~Am_Object(&local_60);
  pAVar8 = (Am_Value *)Am_Object::Get((ushort)&piece_state,(ulong)ROW);
  iVar6 = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = (Am_Value *)Am_Object::Get((ushort)&piece_state,(ulong)COLUMN);
  iVar7 = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = (Am_Value *)Am_Object::Get((ushort)&piece_state,(ulong)KINGED);
  bVar5 = Am_Value::operator_cast_to_bool(pAVar8);
  if (bVar5) {
LAB_00104225:
    uVar9 = iVar6 - uVar1;
    uVar3 = -uVar9;
    if (0 < (int)uVar9) {
      uVar3 = uVar9;
    }
    uVar10 = iVar7 - uVar2;
    uVar9 = -uVar10;
    if (0 < (int)uVar10) {
      uVar9 = uVar10;
    }
    if ((uVar3 < 3) && (uVar3 == uVar9)) {
      if (uVar3 == 2) {
        iVar6 = (int)(iVar7 + uVar2) / 4 + ((int)(iVar6 + uVar1) / 2) * 4;
        if ((Board[iVar6].piece == 0) || (Board[iVar6].black == bVar4)) goto LAB_00104358;
        Am_Object::Set((ushort)&piece,SUB21(JUMPED,0),1);
      }
      else if (uVar3 == 1) {
        pAVar8 = (Am_Value *)Am_Object::Get((ushort)&piece,(ulong)LAST_JUMPED);
        bVar4 = Am_Value::operator_cast_to_bool(pAVar8);
        if (bVar4) goto LAB_00104358;
      }
      *out_x = uVar2 * 0x32;
      *out_y = uVar1 * 0x32;
      Am_Translate_Coordinates(&board,*out_x,uVar1 * 0x32,ref_obj,out_x,out_y);
      Am_Object::Set((ushort)&piece,SUB21(MOVED,0),1);
      Am_Object::Set((ushort)&piece,(uint)ROW,(ulong)uVar1);
      Am_Object::Set((ushort)&piece,(uint)COLUMN,(ulong)uVar2);
    }
  }
  else if (bVar4) {
    if (iVar6 < (int)uVar1) goto LAB_00104225;
  }
  else if ((int)uVar1 < iVar6) goto LAB_00104225;
LAB_00104358:
  Am_Object::~Am_Object(&piece_state);
LAB_00104362:
  Am_Object::~Am_Object(&board);
  Am_Object::~Am_Object(&window);
  Am_Object::~Am_Object(&piece);
  return;
}

Assistant:

Am_Define_Method(Am_Custom_Gridding_Method, void, snap_to_black,
                 (Am_Object inter, const Am_Object &ref_obj, int x, int y,
                  int &out_x, int &out_y))
{
  Am_Object piece = inter.Get_Owner();
  Am_Object window;
  window = piece.Get(Am_WINDOW);
  Am_Object board = window.Get_Object(BOARD);
  piece.Set(MOVED, false);
  piece.Set(JUMPED, false);
  out_x = x;
  out_y = y;
  Am_Translate_Coordinates(ref_obj, x, y, board, x, y);
  if ((x < 0) || (y < 0) || (x >= 400) || (y >= 400))
    return;
  int row, col;
  row = (y + 25) / 50;
  col = (x + 25) / 50;
  if ((row % 2) == (col % 2))
    return;
  if (Board[(row * 4) + (col / 2)].piece)
    return;
  bool black_player = piece.Get(BLACK_PLAYER);
  int rank = piece.Get(Am_RANK);
  Am_Object piece_state;
  if (black_player)
    piece_state = Black_Pieces.Get_Object(piece_slot[rank]);
  else
    piece_state = Red_Pieces.Get_Object(piece_slot[rank]);
  int piece_row = piece_state.Get(ROW);
  int piece_col = piece_state.Get(COLUMN);
  if (!(bool)piece_state.Get(KINGED)) {
    if (black_player) {
      if (row <= piece_row)
        return;
    } else {
      if (row >= piece_row)
        return;
    }
  }
  int row_diff = DIFF(piece_row, row);
  int col_diff = DIFF(piece_col, col);
  if ((row_diff != col_diff) || (row_diff > 2))
    return;
  if ((row_diff == 1) && (bool)piece.Get(LAST_JUMPED))
    return;
  if (row_diff == 2) {
    int jump_row = (row + piece_row) / 2;
    int jump_col = (col + piece_col) / 2;
    int jump_index = (jump_row * 4) + (jump_col / 2);
    if (!Board[jump_index].piece || (Board[jump_index].black == black_player))
      return;
    piece.Set(JUMPED, true);
  }
  out_x = col * 50 /* + (int)inter.Get (Am_X_OFFSET)*/;
  out_y = row * 50 /* + (int)inter.Get (Am_Y_OFFSET)*/;
  Am_Translate_Coordinates(board, out_x, out_y, ref_obj, out_x, out_y);
  piece.Set(MOVED, true);
  piece.Set(ROW, row);
  piece.Set(COLUMN, col);
}